

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O0

LabelId __thiscall
optimization::global_expr_move::Global_Expr_Mov::bfs
          (Global_Expr_Mov *this,int start,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  iterator __i;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __result;
  _Rb_tree_const_iterator<int> __first1;
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  iterator __first2;
  reference piVar4;
  int __c;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  *in_RDX;
  LabelId in_ESI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> iVar6;
  int p_4;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> tmp;
  set<int,_std::less<int>,_std::allocator<int>_> precs;
  int p_3;
  iterator __end3;
  iterator __begin3;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3;
  int p_2;
  iterator __end4_1;
  iterator __begin4_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range4_1;
  int x;
  iterator __end6;
  iterator __begin6;
  set<int,_std::less<int>,_std::allocator<int>_> *__range6;
  int p_1;
  iterator __end4;
  iterator __begin4;
  set<int,_std::less<int>,_std::allocator<int>_> *__range4;
  set<int,_std::less<int>,_std::allocator<int>_> disabled_pre;
  int f;
  LabelId p;
  set<int,_std::less<int>,_std::allocator<int>_> res;
  set<int,_std::less<int>,_std::allocator<int>_> prec;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  const_iterator in_stack_fffffffffffffaf8;
  _Iter in_stack_fffffffffffffb00;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffb08;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *in_stack_fffffffffffffb10;
  _Rb_tree_const_iterator<int> __last2;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  *in_stack_fffffffffffffb40;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  int in_stack_fffffffffffffc14;
  _Self in_stack_fffffffffffffc18;
  _Self local_3e0;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_3d8;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_3a0;
  _Base_ptr local_390;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_388;
  _Base_ptr local_378;
  _Base_ptr local_370;
  _Base_ptr local_368;
  _Base_ptr local_360;
  int local_2f4;
  _Self local_2f0;
  _Self local_2e8;
  _Rb_tree_node_base *local_2e0;
  _Base_ptr local_2d8;
  _Base_ptr local_2d0;
  int local_2c4;
  _Self local_2c0;
  _Self local_2b8;
  undefined1 *local_2b0;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  int local_294;
  _Self local_290;
  _Self local_288;
  undefined1 local_280 [48];
  undefined1 *local_250;
  _Base_ptr local_248;
  undefined1 local_240;
  int local_1e4;
  _Self local_1e0;
  _Self local_1d8;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_1d0;
  undefined1 local_1c8 [48];
  char local_198 [48];
  _Base_ptr local_168;
  int local_15c;
  _Base_ptr local_158;
  undefined1 local_150;
  _Base_ptr local_98;
  LabelId local_8c;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  local_88;
  undefined4 local_54;
  _Rb_tree_node_base local_50;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  *in_stack_ffffffffffffffd8;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  *pvVar7;
  int start_00;
  undefined4 in_stack_ffffffffffffffe8;
  LabelId local_4;
  
  pvVar7 = in_RDX;
  std::
  __shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x180e32);
  start_00 = (int)((ulong)pvVar7 >> 0x20);
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::at(in_stack_fffffffffffffb10,(key_type *)in_stack_fffffffffffffb08);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
             (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8);
  sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x180e67);
  if (sVar2 == 0) {
    local_54 = 1;
    local_4 = in_ESI;
  }
  else {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x180e98);
    sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)0x180ea5);
    if (sVar2 == 1) {
      local_98 = (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            in_stack_fffffffffffffae8);
      std::_Rb_tree_const_iterator<int>::operator*
                ((_Rb_tree_const_iterator<int> *)
                 CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
      std::
      variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ::variant((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                 *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                in_stack_fffffffffffffae8);
      local_8c = bfs((Global_Expr_Mov *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),start_00,
                     in_stack_ffffffffffffffd8);
      std::
      __shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x180f30);
      std::
      map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
      ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
            *)in_stack_fffffffffffffb10,(key_type *)in_stack_fffffffffffffb08);
      std::
      variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ::variant((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                 *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                in_stack_fffffffffffffae8);
      in_stack_fffffffffffffb9f =
           BlockOps::has_op((BlockOps *)
                            CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
                            (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                             *)in_stack_fffffffffffffb90._M_node);
      if ((bool)in_stack_fffffffffffffb9f) {
        pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffb10,
                           (value_type_conflict3 *)in_stack_fffffffffffffb08);
        in_stack_fffffffffffffb90 = pVar5.first._M_node;
        local_150 = pVar5.second;
        local_158 = in_stack_fffffffffffffb90._M_node;
      }
      iVar6.iter._M_node = in_stack_fffffffffffffb00._M_node;
      iVar6.container = in_stack_fffffffffffffb08;
    }
    else {
      local_168 = (_Base_ptr)
                  std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             in_stack_fffffffffffffae8);
      piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)
                          CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
      local_15c = *piVar4;
      get_precedings((Global_Expr_Mov *)in_stack_fffffffffffffc18._M_node,in_stack_fffffffffffffc14)
      ;
      pcVar3 = local_198;
      std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                 (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x18105f);
      pcVar3 = std::
               variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
               ::index(in_RDX,pcVar3,__c);
      if (pcVar3 != (char *)0x0) {
        std::set<int,_std::less<int>,_std::allocator<int>_>::set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x181083);
        local_1d0 = &local_88;
        local_1d8._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8)
        ;
        local_1e0._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8)
        ;
        while (bVar1 = std::operator!=(&local_1d8,&local_1e0), bVar1) {
          piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                             ((_Rb_tree_const_iterator<int> *)
                              CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
          local_1e4 = *piVar4;
          std::
          __shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1810fd);
          std::
          map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
          ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                *)in_stack_fffffffffffffb10,(key_type *)in_stack_fffffffffffffb08);
          std::
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          ::variant((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                    in_stack_fffffffffffffae8);
          bVar1 = BlockOps::disable_op
                            ((BlockOps *)in_stack_fffffffffffffb48._M_node,in_stack_fffffffffffffb40
                            );
          if ((bVar1) &&
             (sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                 in_stack_fffffffffffffb00._M_node,
                                 (key_type *)in_stack_fffffffffffffaf8._M_node), sVar2 == 0)) {
            pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffffb10,
                               (value_type_conflict3 *)in_stack_fffffffffffffb08);
            local_248 = (_Base_ptr)pVar5.first._M_node;
            local_240 = pVar5.second;
            get_precedings((Global_Expr_Mov *)in_stack_fffffffffffffc18._M_node,
                           in_stack_fffffffffffffc14);
            local_250 = local_280;
            local_288._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            in_stack_fffffffffffffae8);
            local_290._M_node =
                 (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            in_stack_fffffffffffffae8);
            while (bVar1 = std::operator!=(&local_288,&local_290), bVar1) {
              piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                                 ((_Rb_tree_const_iterator<int> *)
                                  CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
              local_294 = *piVar4;
              pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                 in_stack_fffffffffffffb10,
                                 (value_type_conflict3 *)in_stack_fffffffffffffb08);
              local_2a8 = (_Base_ptr)pVar5.first._M_node;
              in_stack_fffffffffffffb57 = pVar5.second;
              local_2a0 = in_stack_fffffffffffffb57;
              std::_Rb_tree_const_iterator<int>::operator++
                        ((_Rb_tree_const_iterator<int> *)
                         CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
            }
            local_54 = 4;
            std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)0x181272);
          }
          std::_Rb_tree_const_iterator<int>::operator++
                    ((_Rb_tree_const_iterator<int> *)
                     CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
        }
        local_2b0 = local_1c8;
        local_2b8._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8)
        ;
        local_2c0._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8)
        ;
        while (bVar1 = std::operator!=(&local_2b8,&local_2c0), bVar1) {
          piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                             ((_Rb_tree_const_iterator<int> *)
                              CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
          local_2c4 = *piVar4;
          in_stack_fffffffffffffb48._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::count
                         (in_stack_fffffffffffffb00._M_node,in_stack_fffffffffffffaf8._M_node);
          if ((BlockOps *)in_stack_fffffffffffffb48._M_node != (BlockOps *)0x0) {
            std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                       (key_type *)in_stack_fffffffffffffae8);
          }
          std::_Rb_tree_const_iterator<int>::operator++
                    ((_Rb_tree_const_iterator<int> *)
                     CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
        }
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1813df);
      }
      __last2._M_node = &local_50;
      local_2d0 = (_Base_ptr)
                  std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)
                             in_stack_fffffffffffffae8);
      __first2 = std::set<int,std::less<int>,std::allocator<int>>::erase_abi_cxx11_
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                            in_stack_fffffffffffffaf8);
      local_2e0 = &local_50;
      local_2d8 = __first2._M_node;
      local_2e8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8);
      local_2f0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8);
      iVar6.iter._M_node = in_stack_fffffffffffffb00._M_node;
      iVar6.container = in_stack_fffffffffffffb08;
      while( true ) {
        bVar1 = std::operator!=(&local_2e8,&local_2f0);
        if (!bVar1) break;
        piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)
                            CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
        local_2f4 = *piVar4;
        get_precedings((Global_Expr_Mov *)in_stack_fffffffffffffc18._M_node,
                       in_stack_fffffffffffffc14);
        std::set<int,_std::less<int>,_std::allocator<int>_>::set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1814d1);
        in_stack_fffffffffffffb10 = &local_88;
        local_360 = (_Base_ptr)
                    std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffffae8);
        local_368 = (_Base_ptr)
                    std::set<int,_std::less<int>,_std::allocator<int>_>::end
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffffae8);
        local_370 = (_Base_ptr)
                    std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffffae8);
        local_378 = (_Base_ptr)
                    std::set<int,_std::less<int>,_std::allocator<int>_>::end
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffffae8);
        local_390 = (_Base_ptr)
                    std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffffae8);
        __i._M_node._7_1_ = in_stack_fffffffffffffaf7;
        __i._M_node._0_7_ = in_stack_fffffffffffffaf0;
        iVar6 = std::inserter<std::set<int,std::less<int>,std::allocator<int>>>
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffae8,__i);
        __first1._M_node._7_1_ = in_stack_fffffffffffffb57;
        __first1._M_node._0_7_ = in_stack_fffffffffffffb50;
        __result.iter._M_node = (_Base_ptr)iVar6.container;
        __result.container =
             (set<int,_std::less<int>,_std::allocator<int>_> *)iVar6.iter._M_node._M_node;
        local_388 = iVar6;
        iVar6 = std::
                set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                          (__first1,in_stack_fffffffffffffb48,
                           (_Rb_tree_const_iterator<int>)__first2._M_node,__last2,__result);
        local_3a0 = iVar6;
        std::set<int,_std::less<int>,_std::allocator<int>_>::set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                   (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8);
        std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                   (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8);
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x181607);
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x181614);
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x181621);
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)
                   CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
      }
    }
    local_3d8 = &local_88;
    local_3e0._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8);
    std::set<int,_std::less<int>,_std::allocator<int>_>::end
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffae8);
    while( true ) {
      bVar1 = std::operator!=(&local_3e0,(_Self *)&stack0xfffffffffffffc18);
      local_4 = in_ESI;
      if (!bVar1) break;
      piVar4 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)
                          CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
      local_4 = *piVar4;
      std::
      __shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1816e2);
      std::
      map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
      ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
            *)in_stack_fffffffffffffb10,(key_type *)iVar6.container);
      std::
      variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ::variant((variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                 *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                in_stack_fffffffffffffae8);
      in_stack_fffffffffffffaf7 =
           BlockOps::has_op((BlockOps *)
                            CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
                            (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                             *)in_stack_fffffffffffffb90._M_node);
      if ((bool)in_stack_fffffffffffffaf7) break;
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)
                 CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    }
    local_54 = 1;
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x18178b);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1817b6);
  return local_4;
}

Assistant:

mir::types::LabelId bfs(int start, std::variant<Op, LoadOp> op) {
    auto prec = env->func.basic_blks.at(start).preceding;
    if (prec.size() == 0) {
      return start;
    }
    std::set<mir::types::LabelId> res;
    if (prec.size() == 1) {
      auto p = bfs(*prec.begin(), op);
      if (env->blk_op_map.at(p).has_op(op)) {
        res.insert(p);
      }
    } else {
      auto f = *prec.begin();
      res = get_precedings(f);
      if (op.index() != 0) {
        std::set<mir::types::LabelId> disabled_pre;
        for (auto p : res) {
          if (env->blk_op_map.at(p).disable_op(op)) {
            if (disabled_pre.count(p)) {
              continue;
            }
            disabled_pre.insert(p);
            for (auto x : get_precedings(p)) {
              disabled_pre.insert(x);
            }
          }
        }
        for (auto p : disabled_pre) {
          if (res.count(p)) {
            res.erase(p);
          }
        }
      }

      prec.erase(prec.begin());
      for (auto p : prec) {
        auto precs = get_precedings(p);
        std::set<int> tmp;
        std::set_intersection(res.begin(), res.end(), precs.begin(),
                              precs.end(), std::inserter(tmp, tmp.begin()));
        res = std::set(tmp);
      }
    }

    for (auto p : res) {
      if (env->blk_op_map.at(p).has_op(op)) {
        return p;
      }
    }
    return start;
  }